

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile_test.cpp
# Opt level: O2

bool create_test_ini_file(bool last_empty_section)

{
  int iVar1;
  FILE *__s;
  long lVar2;
  uint uVar3;
  char cVar4;
  long lVar5;
  bool bVar6;
  
  __s = fopen("./p_ini_test_file.ini","w");
  if (__s == (FILE *)0x0) {
    bVar6 = false;
  }
  else {
    lVar2 = p_malloc0(0x801);
    cVar4 = 'a';
    uVar3 = 0;
    for (lVar5 = 0; lVar5 != 0x800; lVar5 = lVar5 + 1) {
      *(char *)(lVar2 + lVar5) = cVar4 + (char)((uVar3 & 0xffff) / 0x14) * -0x14;
      cVar4 = cVar4 + '\x01';
      uVar3 = uVar3 + 1;
    }
    fwrite("[empty_section]\n",0x10,1,__s);
    fwrite("[numeric_section]\n",0x12,1,__s);
    fwrite("int_parameter_1 = 4\n",0x14,1,__s);
    fwrite("int_parameter_2 = 5 ;This is a comment\n",0x27,1,__s);
    fwrite("int_parameter_3 = 6 #This is another type of a comment\n",0x37,1,__s);
    fwrite("# Whole line is a comment\n",0x1a,1,__s);
    fwrite("; Yet another comment line\n",0x1b,1,__s);
    fwrite("float_parameter_1 = 3.24\n",0x19,1,__s);
    fwrite("float_parameter_2 = 0.15\n",0x19,1,__s);
    fwrite("[string_section]\n",0x11,1,__s);
    fwrite("string_parameter_1 = Test string\n",0x21,1,__s);
    fwrite("string_parameter_2 = \"Test string with #\'\"\n",0x2b,1,__s);
    fwrite("string_parameter_3 = \n",0x16,1,__s);
    fwrite("string_parameter_4 = 12345 ;Comment\n",0x24,1,__s);
    fwrite("string_parameter_4 = 54321\n",0x1b,1,__s);
    fwrite("string_parameter_5 = \'Test string\'\n",0x23,1,__s);
    fprintf(__s,"string_parameter_6 = %s\n",lVar2);
    fwrite("string_parameter_7 = \'\'\n",0x18,1,__s);
    fwrite("string_parameter_8 = \"\"\n",0x18,1,__s);
    fprintf(__s,"%s = stress line\n",lVar2);
    fwrite("[boolean_section]\n",0x12,1,__s);
    fwrite("boolean_parameter_1 = TRUE ;True value\n",0x27,1,__s);
    fwrite("boolean_parameter_2 = 0 ;False value\n",0x25,1,__s);
    fwrite("boolean_parameter_3 = false ;False value\n",0x29,1,__s);
    fwrite("boolean_parameter_4 = 1 ;True value\n",0x24,1,__s);
    fwrite("[list_section]\n",0xf,1,__s);
    fwrite("list_parameter_1 = {1\t2\t5\t10} ;First list\n",0x2a,1,__s);
    fwrite("list_parameter_2 = {2.0 3.0 5.0} #Second list\n",0x2e,1,__s);
    fwrite("list_parameter_3 = {true FALSE 1} #Last list\n",0x2d,1,__s);
    if (last_empty_section) {
      fwrite("[empty_section_2]\n",0x12,1,__s);
    }
    p_free(lVar2);
    iVar1 = fclose(__s);
    bVar6 = iVar1 == 0;
  }
  return bVar6;
}

Assistant:

static bool create_test_ini_file (bool last_empty_section)
{
	FILE *file = fopen ("." P_DIR_SEPARATOR "p_ini_test_file.ini", "w");

	if (file == NULL)
		return false;

	pchar *buf = (pchar *) p_malloc0 (PINIFILE_STRESS_LINE + 1);

	for (int i = 0; i < PINIFILE_STRESS_LINE; ++i)
		buf[i] = (pchar) (97 + i % 20);

	/* Empty section */
	fprintf (file, "[empty_section]\n");

	/* Numeric section */
	fprintf (file, "[numeric_section]\n");
	fprintf (file, "int_parameter_1 = 4\n");
	fprintf (file, "int_parameter_2 = 5 ;This is a comment\n");
	fprintf (file, "int_parameter_3 = 6 #This is another type of a comment\n");
	fprintf (file, "# Whole line is a comment\n");
	fprintf (file, "; Yet another comment line\n");
	fprintf (file, "float_parameter_1 = 3.24\n");
	fprintf (file, "float_parameter_2 = 0.15\n");

	/* String section */
	fprintf (file, "[string_section]\n");
	fprintf (file, "string_parameter_1 = Test string\n");
	fprintf (file, "string_parameter_2 = \"Test string with #'\"\n");
	fprintf (file, "string_parameter_3 = \n");
	fprintf (file, "string_parameter_4 = 12345 ;Comment\n");
	fprintf (file, "string_parameter_4 = 54321\n");
	fprintf (file, "string_parameter_5 = 'Test string'\n");
	fprintf (file, "string_parameter_6 = %s\n", buf);
	fprintf (file, "string_parameter_7 = ''\n");
	fprintf (file, "string_parameter_8 = \"\"\n");
	fprintf (file, "%s = stress line\n", buf);

	/* Boolean section */
	fprintf (file, "[boolean_section]\n");
	fprintf (file, "boolean_parameter_1 = TRUE ;True value\n");
	fprintf (file, "boolean_parameter_2 = 0 ;False value\n");
	fprintf (file, "boolean_parameter_3 = false ;False value\n");
	fprintf (file, "boolean_parameter_4 = 1 ;True value\n");

	/* List section */
	fprintf (file, "[list_section]\n");
	fprintf (file, "list_parameter_1 = {1\t2\t5\t10} ;First list\n");
	fprintf (file, "list_parameter_2 = {2.0 3.0 5.0} #Second list\n");
	fprintf (file, "list_parameter_3 = {true FALSE 1} #Last list\n");

	/* Empty section */
	if (last_empty_section)
		fprintf (file, "[empty_section_2]\n");

	p_free (buf);

	return fclose (file) == 0;
}